

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_type(lyout *out,int level,lys_module *module,lys_type *type)

{
  lys_type *module_00;
  lyout *out_00;
  int iVar1;
  uint uVar2;
  lys_module *plVar3;
  char *pcVar4;
  lys_module *plVar5;
  lys_module *mod;
  char *s;
  char *str;
  int local_30;
  int content2;
  int content;
  uint i;
  lys_type *type_local;
  lys_module *module_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  local_30 = 0;
  str._4_4_ = 0;
  _content = type;
  type_local = (lys_type *)module;
  module_local._4_4_ = level;
  plStack_10 = out;
  iVar1 = lys_type_is_local(type);
  out_00 = plStack_10;
  module_00 = type_local;
  if (iVar1 == 0) {
    uVar2 = module_local._4_4_ << 1;
    plVar3 = lys_main_module(_content->der->module);
    pcVar4 = transform_module_name2import_prefix((lys_module *)module_00,plVar3->name);
    ly_print(out_00,"%*s<type name=\"%s:%s\"",(ulong)uVar2,"",pcVar4,_content->der->name);
  }
  else {
    yin_print_open(plStack_10,module_local._4_4_,(char *)0x0,"type","name",_content->der->name,
                   local_30);
  }
  module_local._4_4_ = module_local._4_4_ + 1;
  if (_content->ext_size != '\0') {
    yin_print_close_parent(plStack_10,&local_30);
    yin_print_extension_instances
              (plStack_10,module_local._4_4_,(lys_module *)type_local,LYEXT_SUBSTMT_SELF,'\0',
               _content->ext,(uint)_content->ext_size);
  }
  switch(_content->base) {
  case LY_TYPE_BINARY:
    if ((_content->info).bits.bit != (lys_type_bit *)0x0) {
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_typerestr(plStack_10,module_local._4_4_,(lys_module *)type_local,
                          (_content->info).dec64.range,"length");
    }
    break;
  case LY_TYPE_BITS:
    for (content2 = 0; (uint)content2 < (_content->info).bits.count; content2 = content2 + 1) {
      str._4_4_ = 0;
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_open(plStack_10,module_local._4_4_,(char *)0x0,"bit","name",
                     (_content->info).bits.bit[(uint)content2].name,str._4_4_);
      yin_print_snode_common
                (plStack_10,module_local._4_4_ + 1,
                 (lys_node *)((_content->info).bits.bit + (uint)content2),(lys_module *)type_local,
                 (int *)((long)&str + 4),3);
      if (((_content->info).bits.bit[(uint)content2].flags & 1) == 0) {
        yin_print_close_parent(plStack_10,(int *)((long)&str + 4));
        yin_print_unsigned(plStack_10,module_local._4_4_ + 1,LYEXT_SUBSTMT_POSITION,'\0',
                           (lys_module *)type_local,(_content->info).bits.bit[(uint)content2].ext,
                           (uint)(_content->info).bits.bit[(uint)content2].ext_size,
                           (_content->info).bits.bit[(uint)content2].pos);
      }
      yin_print_snode_common
                (plStack_10,module_local._4_4_ + 1,
                 (lys_node *)((_content->info).bits.bit + (uint)content2),(lys_module *)type_local,
                 (int *)((long)&str + 4),0x70);
      yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"bit",str._4_4_);
    }
    break;
  default:
    break;
  case LY_TYPE_DEC64:
    if ((_content->der->type).der == (lys_tpdf *)0x0) {
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_DIGITS,'\0',
                         (lys_module *)type_local,_content->ext,(uint)_content->ext_size,
                         (uint)(_content->info).dec64.dig);
    }
    if ((_content->info).bits.bit != (lys_type_bit *)0x0) {
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_typerestr(plStack_10,module_local._4_4_,(lys_module *)type_local,
                          (_content->info).dec64.range,"range");
    }
    break;
  case LY_TYPE_ENUM:
    for (content2 = 0; (uint)content2 < (_content->info).bits.count; content2 = content2 + 1) {
      str._4_4_ = 0;
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_open(plStack_10,module_local._4_4_,(char *)0x0,"enum","name",
                     (_content->info).bits.bit[(uint)content2].name,str._4_4_);
      yin_print_snode_common
                (plStack_10,module_local._4_4_ + 1,
                 (lys_node *)((_content->info).bits.bit + (uint)content2),(lys_module *)type_local,
                 (int *)((long)&str + 4),3);
      if (((_content->info).bits.bit[(uint)content2].flags & 1) == 0) {
        yin_print_close_parent(plStack_10,(int *)((long)&str + 4));
        yin_print_signed(plStack_10,module_local._4_4_ + 1,LYEXT_SUBSTMT_VALUE,'\0',
                         (lys_module *)type_local,(_content->info).bits.bit[(uint)content2].ext,
                         (uint)(_content->info).bits.bit[(uint)content2].ext_size,
                         (_content->info).bits.bit[(uint)content2].pos);
      }
      yin_print_snode_common
                (plStack_10,module_local._4_4_ + 1,
                 (lys_node *)((_content->info).bits.bit + (uint)content2),(lys_module *)type_local,
                 (int *)((long)&str + 4),0x70);
      yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"enum",str._4_4_);
    }
    break;
  case LY_TYPE_IDENT:
    if ((_content->info).bits.count != 0) {
      yin_print_close_parent(plStack_10,&local_30);
      for (content2 = 0; (uint)content2 < (_content->info).bits.count; content2 = content2 + 1) {
        plVar3 = lys_main_module(*(lys_module **)
                                  ((&((_content->info).bits.bit)->name)[(uint)content2] + 0x30));
        plVar5 = lys_main_module((lys_module *)type_local);
        if (plVar5 == plVar3) {
          yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_BASE,'\0',
                            *(char **)(&((_content->info).bits.bit)->name)[(uint)content2],
                            (lys_module *)type_local,
                            *(lys_ext_instance ***)
                             ((&((_content->info).bits.bit)->name)[(uint)content2] + 0x20),
                            (uint)(byte)(&((_content->info).bits.bit)->name)[(uint)content2][0x1a]);
        }
        else {
          pcVar4 = transform_module_name2import_prefix((lys_module *)type_local,plVar3->name);
          iVar1 = asprintf((char **)&mod,"%s:%s",pcVar4,
                           *(undefined8 *)(&((_content->info).bits.bit)->name)[(uint)content2]);
          if (iVar1 == -1) {
            ly_log(*(ly_ctx **)type_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "yin_print_type");
          }
          else {
            yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_BASE,'\0',(char *)mod,
                              (lys_module *)type_local,
                              *(lys_ext_instance ***)
                               ((&((_content->info).bits.bit)->name)[(uint)content2] + 0x20),
                              (uint)(byte)(&((_content->info).bits.bit)->name)[(uint)content2][0x1a]
                             );
            free(mod);
          }
        }
      }
    }
    break;
  case LY_TYPE_INST:
    if ((_content->info).inst.req == '\x01') {
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_REQINSTANCE,'\0',"true",
                        (lys_module *)type_local,_content->ext,(uint)_content->ext_size);
    }
    else if ((_content->info).inst.req == -1) {
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_REQINSTANCE,'\0',"false",
                        (lys_module *)type_local,_content->ext,(uint)_content->ext_size);
    }
    break;
  case LY_TYPE_LEAFREF:
    iVar1 = ly_strequal_(_content->der->name,"leafref");
    if (iVar1 != 0) {
      yin_print_close_parent(plStack_10,&local_30);
      s = transform_json2schema((lys_module *)type_local,(_content->info).lref.path);
      yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_PATH,'\0',s,
                        (lys_module *)type_local,_content->ext,(uint)_content->ext_size);
      lydict_remove(*(ly_ctx **)type_local,s);
    }
    if ((_content->info).lref.req == '\x01') {
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_REQINSTANCE,'\0',"true",
                        (lys_module *)type_local,_content->ext,(uint)_content->ext_size);
    }
    else if ((_content->info).lref.req == -1) {
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_REQINSTANCE,'\0',"false",
                        (lys_module *)type_local,_content->ext,(uint)_content->ext_size);
    }
    break;
  case LY_TYPE_STRING:
    if ((_content->info).bits.bit != (lys_type_bit *)0x0) {
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_typerestr(plStack_10,module_local._4_4_,(lys_module *)type_local,
                          (_content->info).dec64.range,"length");
    }
    for (content2 = 0; (uint)content2 < (_content->info).str.pat_count; content2 = content2 + 1) {
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_typerestr(plStack_10,module_local._4_4_,(lys_module *)type_local,
                          (lys_restr *)
                          (((_content->info).lref.target)->padding +
                          (ulong)(uint)content2 * 0x38 + -0x1c),"pattern");
    }
    break;
  case LY_TYPE_UNION:
    for (content2 = 0; (uint)content2 < (_content->info).bits.count; content2 = content2 + 1) {
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_type(plStack_10,module_local._4_4_,(lys_module *)type_local,
                     (lys_type *)((long)(_content->info).bits.bit + (ulong)(uint)content2 * 0x40));
    }
    break;
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    if ((_content->info).bits.bit != (lys_type_bit *)0x0) {
      yin_print_close_parent(plStack_10,&local_30);
      yin_print_typerestr(plStack_10,module_local._4_4_,(lys_module *)type_local,
                          (_content->info).dec64.range,"range");
    }
  }
  module_local._4_4_ = module_local._4_4_ + -1;
  yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"type",local_30);
  return;
}

Assistant:

static void
yin_print_type(struct lyout *out, int level, const struct lys_module *module, const struct lys_type *type)
{
    unsigned int i;
    int content = 0, content2 = 0;
    const char *str;
    char *s;
    struct lys_module *mod;

    if (!lys_type_is_local(type)) {
        ly_print(out, "%*s<type name=\"%s:%s\"", LEVEL, INDENT,
                 transform_module_name2import_prefix(module, lys_main_module(type->der->module)->name), type->der->name);
    } else {
        yin_print_open(out, level, NULL, "type", "name", type->der->name, content);
    }
    level++;

    /* extensions */
    if (type->ext_size) {
        yin_print_close_parent(out, &content);
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, type->ext, type->ext_size);
    }


    switch (type->base) {
    case LY_TYPE_BINARY:
        if (type->info.binary.length) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.binary.length, "length");
        }
        break;
    case LY_TYPE_BITS:
        for (i = 0; i < type->info.bits.count; ++i) {
            content2 = 0;
            yin_print_close_parent(out, &content);
            yin_print_open(out, level, NULL, "bit", "name", type->info.bits.bit[i].name, content2);
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.bits.bit[i], module, &content2,
                                   SNODE_COMMON_EXT | SNODE_COMMON_IFF);
            if (!(type->info.bits.bit[i].flags & LYS_AUTOASSIGNED)) {
                yin_print_close_parent(out, &content2);
                yin_print_unsigned(out, level + 1, LYEXT_SUBSTMT_POSITION, 0, module,
                                   type->info.bits.bit[i].ext, type->info.bits.bit[i].ext_size,
                                   type->info.bits.bit[i].pos);
            }
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.bits.bit[i], module, &content2,
                                   SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
            yin_print_close(out, level, NULL, "bit", content2);
        }
        break;
    case LY_TYPE_DEC64:
        if (!type->der->type.der) {
            yin_print_close_parent(out, &content);
            yin_print_unsigned(out, level, LYEXT_SUBSTMT_DIGITS, 0, module,
                               type->ext, type->ext_size, type->info.dec64.dig);
        }
        if (type->info.dec64.range) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.dec64.range, "range");
        }
        break;
    case LY_TYPE_ENUM:
        for (i = 0; i < type->info.enums.count; i++) {
            content2 = 0;
            yin_print_close_parent(out, &content);
            yin_print_open(out, level, NULL, "enum", "name", type->info.enums.enm[i].name, content2);
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.enums.enm[i], module, &content2,
                                   SNODE_COMMON_EXT | SNODE_COMMON_IFF);
            if (!(type->info.enums.enm[i].flags & LYS_AUTOASSIGNED)) {
                yin_print_close_parent(out, &content2);
                yin_print_signed(out, level + 1, LYEXT_SUBSTMT_VALUE, 0, module,
                                 type->info.enums.enm[i].ext, type->info.enums.enm[i].ext_size,
                                 type->info.enums.enm[i].value);
            }
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.enums.enm[i], module, &content2,
                                   SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
            yin_print_close(out, level, NULL, "enum", content2);
        }
        break;
    case LY_TYPE_IDENT:
        if (type->info.ident.count) {
            yin_print_close_parent(out, &content);
            for (i = 0; i < type->info.ident.count; ++i) {
                mod = lys_main_module(type->info.ident.ref[i]->module);
                if (lys_main_module(module) == mod) {
                    yin_print_substmt(out, level, LYEXT_SUBSTMT_BASE, 0, type->info.ident.ref[i]->name,
                                      module, type->info.ident.ref[i]->ext, type->info.ident.ref[i]->ext_size);
                } else {
                    if (asprintf(&s, "%s:%s", transform_module_name2import_prefix(module, mod->name),
                                 type->info.ident.ref[i]->name) == -1) {
                        LOGMEM(module->ctx);
                    } else {
                        yin_print_substmt(out, level, LYEXT_SUBSTMT_BASE, 0, s,
                                          module, type->info.ident.ref[i]->ext, type->info.ident.ref[i]->ext_size);
                        free(s);
                    }
                }
            }
        }
        break;
    case LY_TYPE_INST:
        if (type->info.inst.req == 1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "true", module, type->ext, type->ext_size);
        } else if (type->info.inst.req == -1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "false", module, type->ext, type->ext_size);
        }
        break;
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        if (type->info.num.range) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.num.range, "range");
        }
        break;
    case LY_TYPE_LEAFREF:
        if (ly_strequal(type->der->name, "leafref", 0)) {
            yin_print_close_parent(out, &content);
            str = transform_json2schema(module, type->info.lref.path);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_PATH, 0, str, module, type->ext, type->ext_size);
            lydict_remove(module->ctx, str);
        }
        if (type->info.lref.req == 1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "true", module, type->ext, type->ext_size);
        } else if (type->info.lref.req == -1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "false", module, type->ext, type->ext_size);
        }
        break;
    case LY_TYPE_STRING:
        if (type->info.str.length) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.str.length, "length");
        }
        for (i = 0; i < type->info.str.pat_count; i++) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, &type->info.str.patterns[i], "pattern");
        }
        break;
    case LY_TYPE_UNION:
        for (i = 0; i < type->info.uni.count; ++i) {
            yin_print_close_parent(out, &content);
            yin_print_type(out, level, module, &type->info.uni.types[i]);
        }
        break;
    default:
        /* other types do not have substatements */
        break;
    }

    level--;
    yin_print_close(out, level, NULL, "type", content);
}